

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::FiberStack::~FiberStack(FiberStack *this)

{
  Impl::free(this->impl,(void *)this->stackSize);
  if ((this->main).tag == 1) {
    (this->main).tag = 0;
  }
  if ((this->main).tag == 2) {
    (this->main).tag = 0;
  }
  return;
}

Assistant:

FiberStack::~FiberStack() noexcept(false) {
#if KJ_USE_FIBERS
#if _WIN32 || __CYGWIN__
  DeleteFiber(osFiber);
#else
  Impl::free(impl, stackSize);
#endif
#endif
}